

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::getIis(Highs *this,HighsIis *iis)

{
  HighsModelStatus model_status;
  HighsStatus call_status;
  HighsStatus HVar1;
  allocator local_a9;
  string local_a8;
  HighsLogOptions local_88;
  
  model_status = this->model_status_;
  HVar1 = kOk;
  if (model_status != kMin) {
    if (model_status == kUnbounded) {
LAB_002362c2:
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                   "Calling Highs::getIis for a model that is known to be feasible\n");
      HighsIis::invalidate(iis);
      iis->valid_ = true;
      return kOk;
    }
    if (model_status != kInfeasible) {
      if (model_status == kOptimal) goto LAB_002362c2;
      utilModelStatusToString_abi_cxx11_(&local_a8,model_status);
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kWarning,
                   "Calling Highs::getIis for a model with status %s\n",local_a8._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_a8);
      HVar1 = kWarning;
    }
  }
  HighsLogOptions::HighsLogOptions(&local_88,&(this->options_).super_HighsOptionsStruct.log_options)
  ;
  call_status = getIisInterface(this);
  std::__cxx11::string::string((string *)&local_a8,"getIisInterface",&local_a9);
  HVar1 = interpretCallStatus(&local_88,call_status,HVar1,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::_Function_base::~_Function_base(&local_88.user_callback.super__Function_base);
  HighsIis::operator=(iis,&this->iis_);
  return HVar1;
}

Assistant:

HighsStatus Highs::getIis(HighsIis& iis) {
  if (this->model_status_ == HighsModelStatus::kOptimal ||
      this->model_status_ == HighsModelStatus::kUnbounded) {
    // Strange to call getIis for a model that's known to be feasible
    highsLogUser(
        options_.log_options, HighsLogType::kInfo,
        "Calling Highs::getIis for a model that is known to be feasible\n");
    iis.invalidate();
    // No IIS exists, so validate the empty HighsIis instance
    iis.valid_ = true;
    return HighsStatus::kOk;
  }
  HighsStatus return_status = HighsStatus::kOk;
  if (this->model_status_ != HighsModelStatus::kNotset &&
      this->model_status_ != HighsModelStatus::kInfeasible) {
    return_status = HighsStatus::kWarning;
    highsLogUser(options_.log_options, HighsLogType::kWarning,
                 "Calling Highs::getIis for a model with status %s\n",
                 this->modelStatusToString(this->model_status_).c_str());
  }
  return_status =
      interpretCallStatus(options_.log_options, this->getIisInterface(),
                          return_status, "getIisInterface");
  iis = this->iis_;
  return return_status;
}